

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

ParameterizedTestSuiteInfo<(anonymous_namespace)::NopZeroXFixture> * __thiscall
testing::internal::ParameterizedTestSuiteRegistry::
GetTestSuitePatternHolder<(anonymous_namespace)::NopZeroXFixture>
          (ParameterizedTestSuiteRegistry *this,char *test_suite_name,CodeLocation *code_location)

{
  pointer ppPVar1;
  ParameterizedTestSuiteInfoBase *pPVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ParameterizedTestSuiteInfo<(anonymous_namespace)::NopZeroXFixture> *pPVar5;
  undefined8 uVar6;
  pointer ppPVar7;
  ParameterizedTestSuiteInfo<(anonymous_namespace)::NopZeroXFixture> *local_80;
  CodeLocation local_78;
  CodeLocation local_50;
  
  ppPVar7 = (this->test_suite_infos_).
            super__Vector_base<testing::internal::ParameterizedTestSuiteInfoBase_*,_std::allocator<testing::internal::ParameterizedTestSuiteInfoBase_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppPVar1 = (this->test_suite_infos_).
            super__Vector_base<testing::internal::ParameterizedTestSuiteInfoBase_*,_std::allocator<testing::internal::ParameterizedTestSuiteInfoBase_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (ppPVar7 == ppPVar1) {
LAB_0017eec5:
      pPVar5 = (ParameterizedTestSuiteInfo<(anonymous_namespace)::NopZeroXFixture> *)
               operator_new(0x80);
      CodeLocation::CodeLocation(&local_78,(CodeLocation *)test_suite_name);
      (pPVar5->super_ParameterizedTestSuiteInfoBase)._vptr_ParameterizedTestSuiteInfoBase =
           (_func_int **)&PTR__ParameterizedTestSuiteInfo_00271558;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&pPVar5->test_suite_name_,"NopZeroXFixture",(allocator<char> *)&local_80)
      ;
      CodeLocation::CodeLocation(&pPVar5->code_location_,&local_78);
      (pPVar5->instantiations_).
      super__Vector_base<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::NopZeroXFixture>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::NopZeroXFixture>::InstantiationInfo>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (pPVar5->instantiations_).
      super__Vector_base<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::NopZeroXFixture>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::NopZeroXFixture>::InstantiationInfo>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (pPVar5->tests_).
      super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::NopZeroXFixture>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::NopZeroXFixture>::TestInfo>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (pPVar5->instantiations_).
      super__Vector_base<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::NopZeroXFixture>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::NopZeroXFixture>::InstantiationInfo>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (pPVar5->tests_).
      super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::NopZeroXFixture>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::NopZeroXFixture>::TestInfo>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (pPVar5->tests_).
      super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::NopZeroXFixture>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::NopZeroXFixture>::TestInfo>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      std::__cxx11::string::~string((string *)&local_78);
      local_80 = pPVar5;
      std::
      vector<testing::internal::ParameterizedTestSuiteInfoBase*,std::allocator<testing::internal::ParameterizedTestSuiteInfoBase*>>
      ::emplace_back<testing::internal::ParameterizedTestSuiteInfoBase*>
                ((vector<testing::internal::ParameterizedTestSuiteInfoBase*,std::allocator<testing::internal::ParameterizedTestSuiteInfoBase*>>
                  *)this,(ParameterizedTestSuiteInfoBase **)&local_80);
      return pPVar5;
    }
    iVar4 = (*(*ppPVar7)->_vptr_ParameterizedTestSuiteInfoBase[2])();
    bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(extraout_var,iVar4),"NopZeroXFixture");
    if (bVar3) {
      iVar4 = (*(*ppPVar7)->_vptr_ParameterizedTestSuiteInfoBase[3])();
      if ((undefined1 *)CONCAT44(extraout_var_00,iVar4) !=
          &TypeIdHelper<(anonymous_namespace)::NopZeroXFixture>::dummy_) {
        CodeLocation::CodeLocation(&local_50,(CodeLocation *)test_suite_name);
        ReportInvalidTestSuiteType("NopZeroXFixture",&local_50);
        CodeLocation::~CodeLocation(&local_50);
        posix::Abort();
      }
      pPVar2 = *ppPVar7;
      if (pPVar2 == (ParameterizedTestSuiteInfoBase *)0x0) {
        uVar6 = __cxa_bad_typeid();
        GTestLog::~GTestLog((GTestLog *)&local_80);
        _Unwind_Resume(uVar6);
      }
      bVar3 = std::type_info::operator==
                        ((type_info *)pPVar2->_vptr_ParameterizedTestSuiteInfoBase[-1],
                         (type_info *)
                         &ParameterizedTestSuiteInfo<(anonymous_namespace)::NopZeroXFixture>::
                          typeinfo);
      bVar3 = IsTrue(bVar3);
      if (!bVar3) {
        GTestLog::GTestLog((GTestLog *)&local_80,GTEST_FATAL,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/googletest-src/googletest/include/gtest/internal/gtest-port.h"
                           ,0x45e);
        std::operator<<((ostream *)&std::cerr,"Condition typeid(*base) == typeid(Derived) failed. ")
        ;
        GTestLog::~GTestLog((GTestLog *)&local_80);
      }
      pPVar5 = (ParameterizedTestSuiteInfo<(anonymous_namespace)::NopZeroXFixture> *)
               __dynamic_cast(pPVar2,&ParameterizedTestSuiteInfoBase::typeinfo,
                              &ParameterizedTestSuiteInfo<(anonymous_namespace)::NopZeroXFixture>::
                               typeinfo,0);
      if (pPVar5 != (ParameterizedTestSuiteInfo<(anonymous_namespace)::NopZeroXFixture> *)0x0) {
        return pPVar5;
      }
      goto LAB_0017eec5;
    }
    ppPVar7 = ppPVar7 + 1;
  } while( true );
}

Assistant:

ParameterizedTestSuiteInfo<TestSuite>* GetTestSuitePatternHolder(
      const char* test_suite_name, CodeLocation code_location) {
    ParameterizedTestSuiteInfo<TestSuite>* typed_test_info = nullptr;
    for (auto& test_suite_info : test_suite_infos_) {
      if (test_suite_info->GetTestSuiteName() == test_suite_name) {
        if (test_suite_info->GetTestSuiteTypeId() != GetTypeId<TestSuite>()) {
          // Complain about incorrect usage of Google Test facilities
          // and terminate the program since we cannot guaranty correct
          // test suite setup and tear-down in this case.
          ReportInvalidTestSuiteType(test_suite_name, code_location);
          posix::Abort();
        } else {
          // At this point we are sure that the object we found is of the same
          // type we are looking for, so we downcast it to that type
          // without further checks.
          typed_test_info = CheckedDowncastToActualType<
              ParameterizedTestSuiteInfo<TestSuite> >(test_suite_info);
        }
        break;
      }
    }
    if (typed_test_info == nullptr) {
      typed_test_info = new ParameterizedTestSuiteInfo<TestSuite>(
          test_suite_name, code_location);
      test_suite_infos_.push_back(typed_test_info);
    }
    return typed_test_info;
  }